

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<double,_3> * __thiscall
tcu::reflect<double,3>
          (Vector<double,_3> *__return_storage_ptr__,tcu *this,Vector<double,_3> *i,
          Vector<double,_3> *n)

{
  double dVar1;
  Vector<double,_3> local_38;
  Vector<double,_3> *local_20;
  Vector<double,_3> *n_local;
  Vector<double,_3> *i_local;
  
  local_20 = i;
  n_local = (Vector<double,_3> *)this;
  i_local = __return_storage_ptr__;
  dVar1 = dot<double,3>(i,(Vector<double,_3> *)this);
  operator*(&local_38,dVar1 * 2.0,local_20);
  operator-(__return_storage_ptr__,(Vector<double,_3> *)this,&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> reflect (const Vector<T, Size>& i, const Vector<T, Size>& n)
{
	return i - T(2) * dot(n, i) * n;
}